

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O0

bool __thiscall kws::Parser::Check(Parser *this,char *name,char *value)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  ostream *poVar5;
  ulong uVar6;
  char *in_RDX;
  char *in_RSI;
  bool forbidRelativePaths;
  bool forbidUsingDirectives;
  string v2_11;
  string v1_11;
  size_t pos_11;
  string val_11;
  string v2_10;
  string v1_10;
  size_t pos_10;
  string val_10;
  string v2_9;
  size_t pos_9;
  bool uppercaseTheDefinition;
  string v1_9;
  string val_9;
  string v2_8;
  string v1_8;
  size_t pos_8;
  string val_8;
  IndentType itype;
  bool blockline;
  bool header;
  string v4_1;
  string v3_3;
  string v2_7;
  size_type pos1_4;
  string v1_7;
  size_t pos_7;
  string val_7;
  bool useCVS;
  bool spaceEndOfLine;
  string v3_2;
  string v2_6;
  size_type pos1_3;
  string v1_6;
  size_t pos_6;
  string val_6;
  bool checkMissingComment;
  string v6;
  bool checkWrongComment;
  string v5;
  bool allowEmptyLine;
  string v4;
  string v3_1;
  string v2_5;
  size_type pos1_2;
  string v1_5;
  size_t pos_5;
  string val_5;
  string v2_4;
  bool checkInlineFunctions;
  size_t pos_4;
  string v1_4;
  string val_4;
  size_t pos_3;
  string v2_3;
  string v1_3;
  string val_3;
  size_t pos_2;
  string v2_2;
  string v1_2;
  string val_2;
  string v3;
  string v2_1;
  size_t pos1_1;
  string v1_1;
  size_t pos_1;
  string val_1;
  bool checkProtected;
  bool alignment_1;
  string v2;
  size_t pos1;
  string v1;
  size_t pos;
  string val;
  bool alignment;
  undefined4 in_stack_ffffffffffffefb8;
  undefined4 in_stack_ffffffffffffefbc;
  string *in_stack_ffffffffffffefc0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffefd0;
  allocator *paVar7;
  Parser *in_stack_ffffffffffffefe0;
  undefined8 in_stack_fffffffffffff060;
  undefined1 forbidRelativePaths_00;
  Parser *in_stack_fffffffffffff068;
  undefined7 in_stack_fffffffffffff090;
  undefined1 in_stack_fffffffffffff097;
  unsigned_long in_stack_fffffffffffff098;
  string *psVar8;
  Parser *in_stack_fffffffffffff0a0;
  undefined8 in_stack_fffffffffffff0b0;
  undefined1 checkEndOfFile;
  unsigned_long in_stack_fffffffffffff0b8;
  Parser *in_stack_fffffffffffff0c0;
  undefined8 in_stack_fffffffffffff0d8;
  Parser *in_stack_fffffffffffff0e0;
  undefined8 in_stack_fffffffffffff0f0;
  undefined1 forbidUsingDirectives_00;
  undefined4 in_stack_fffffffffffff0f8;
  undefined4 in_stack_fffffffffffff0fc;
  undefined8 in_stack_fffffffffffff148;
  undefined1 doNotCheckInsideParenthesis;
  unsigned_long in_stack_fffffffffffff150;
  undefined8 in_stack_fffffffffffff158;
  Parser *in_stack_fffffffffffff160;
  Parser *in_stack_fffffffffffff168;
  unsigned_long in_stack_fffffffffffff198;
  Parser *in_stack_fffffffffffff1a0;
  undefined8 in_stack_fffffffffffff1c0;
  undefined1 checkInlineFunctions_00;
  unsigned_long in_stack_fffffffffffff1c8;
  Parser *in_stack_fffffffffffff1d0;
  char *in_stack_fffffffffffff1e8;
  char *in_stack_fffffffffffff1f0;
  Parser *in_stack_fffffffffffff1f8;
  Parser *in_stack_fffffffffffff200;
  undefined8 in_stack_fffffffffffff218;
  uint uVar9;
  Parser *in_stack_fffffffffffff220;
  char *in_stack_fffffffffffff2e0;
  Parser *in_stack_fffffffffffff2e8;
  undefined8 in_stack_fffffffffffff300;
  undefined2 uVar10;
  unsigned_long in_stack_fffffffffffff308;
  Parser *in_stack_fffffffffffff310;
  undefined8 in_stack_fffffffffffff348;
  undefined1 uppercaseTheDefinition_00;
  char *in_stack_fffffffffffff350;
  Parser *in_stack_fffffffffffff358;
  undefined8 in_stack_fffffffffffff360;
  char *in_stack_fffffffffffff368;
  char *in_stack_fffffffffffff370;
  char *in_stack_fffffffffffff378;
  Parser *in_stack_fffffffffffff380;
  undefined8 in_stack_fffffffffffff400;
  undefined1 uVar11;
  char *in_stack_fffffffffffff408;
  Parser *in_stack_fffffffffffff410;
  allocator local_bc9;
  string local_bc8 [39];
  allocator local_ba1;
  string local_ba0 [32];
  uint in_stack_fffffffffffff480;
  undefined1 in_stack_fffffffffffff487;
  char *in_stack_fffffffffffff488;
  Parser *in_stack_fffffffffffff490;
  string local_b60 [8];
  unsigned_long in_stack_fffffffffffff4a8;
  Parser *in_stack_fffffffffffff4b0;
  allocator local_b31;
  string local_b30 [32];
  string local_b10 [32];
  string local_af0 [32];
  long local_ad0;
  allocator local_ac1;
  string local_ac0 [39];
  allocator local_a99;
  string local_a98 [32];
  string local_a78 [32];
  string local_a58 [8];
  unsigned_long in_stack_fffffffffffff5b0;
  char *in_stack_fffffffffffff5b8;
  Parser *in_stack_fffffffffffff5c0;
  allocator local_a29;
  string local_a28 [39];
  allocator local_a01;
  string local_a00 [32];
  string local_9e0 [32];
  string local_9c0 [32];
  long local_9a0;
  allocator local_991;
  string local_990 [39];
  allocator local_969;
  string local_968 [32];
  undefined4 local_948;
  undefined1 local_942;
  undefined1 local_941;
  string local_940 [32];
  string local_920 [32];
  string local_900 [32];
  long local_8e0;
  string local_8d8 [32];
  long local_8b8;
  allocator local_8a9;
  string local_8a8 [38];
  undefined1 local_882;
  undefined1 local_881;
  string local_880 [32];
  string local_860 [22];
  undefined1 in_stack_fffffffffffff7b6;
  undefined1 in_stack_fffffffffffff7b7;
  char *in_stack_fffffffffffff7b8;
  Parser *in_stack_fffffffffffff7c0;
  string local_838 [39];
  allocator local_811;
  string local_810 [32];
  long local_7f0;
  allocator local_7e1;
  string local_7e0 [14];
  undefined1 in_stack_fffffffffffff82e;
  undefined1 in_stack_fffffffffffff82f;
  char *in_stack_fffffffffffff830;
  Parser *in_stack_fffffffffffff838;
  string local_7b8 [32];
  string local_798 [39];
  allocator local_771;
  string local_770 [39];
  undefined1 local_749;
  string local_748 [32];
  string local_728 [39];
  allocator local_701;
  string local_700 [39];
  undefined1 local_6d9;
  string local_6d8 [24];
  char *in_stack_fffffffffffff940;
  Parser *in_stack_fffffffffffff948;
  allocator local_691;
  string local_690 [32];
  string local_670 [32];
  string local_650 [32];
  long local_630;
  string local_628 [36];
  uint local_604;
  long local_600;
  allocator local_5f1;
  string local_5f0 [39];
  allocator local_5c9;
  string local_5c8 [39];
  allocator local_5a1;
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [39];
  undefined1 local_539;
  long local_538;
  allocator local_529;
  string local_528 [39];
  allocator local_501;
  string local_500 [39];
  allocator local_4d9;
  string local_4d8 [39];
  allocator local_4b1;
  string local_4b0 [39];
  allocator local_489;
  string local_488 [32];
  string local_468 [23];
  undefined1 in_stack_fffffffffffffbaf;
  uint in_stack_fffffffffffffbb0;
  undefined1 in_stack_fffffffffffffbb6;
  undefined1 in_stack_fffffffffffffbb7;
  unsigned_long in_stack_fffffffffffffbb8;
  IndentType in_stack_fffffffffffffbc4;
  Parser *in_stack_fffffffffffffbc8;
  allocator local_419;
  string local_418 [39];
  allocator local_3f1;
  string local_3f0 [39];
  allocator local_3c9;
  string local_3c8 [39];
  allocator local_3a1;
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  long local_340;
  allocator local_331;
  string local_330 [39];
  allocator local_309;
  string local_308 [39];
  allocator local_2e1;
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [39];
  allocator local_279;
  string local_278 [16];
  unsigned_long in_stack_fffffffffffffd98;
  char *in_stack_fffffffffffffda0;
  Parser *in_stack_fffffffffffffda8;
  string local_238 [39];
  allocator local_211;
  string local_210 [32];
  long local_1f0;
  string local_1e8 [32];
  long local_1c8;
  allocator local_1b9;
  string local_1b8 [38];
  undefined1 local_192;
  undefined1 local_191;
  string local_190 [32];
  string local_170 [39];
  allocator local_149;
  string local_148 [32];
  long local_128;
  string local_120 [32];
  long local_100;
  allocator local_f1;
  string local_f0 [38];
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  char *local_20;
  char *local_18;
  byte local_1;
  
  forbidRelativePaths_00 = (undefined1)((ulong)in_stack_fffffffffffff060 >> 0x38);
  forbidUsingDirectives_00 = (undefined1)((ulong)in_stack_fffffffffffff0f0 >> 0x38);
  doNotCheckInsideParenthesis = (undefined1)((ulong)in_stack_fffffffffffff148 >> 0x38);
  checkInlineFunctions_00 = (undefined1)((ulong)in_stack_fffffffffffff1c0 >> 0x38);
  uppercaseTheDefinition_00 = (undefined1)((ulong)in_stack_fffffffffffff348 >> 0x38);
  uVar9 = (uint)((ulong)in_stack_fffffffffffff218 >> 0x20);
  checkEndOfFile = (undefined1)((ulong)in_stack_fffffffffffff0b0 >> 0x38);
  uVar11 = (undefined1)((ulong)in_stack_fffffffffffff400 >> 0x38);
  uVar10 = (undefined2)((ulong)in_stack_fffffffffffff300 >> 0x30);
  local_20 = in_RDX;
  local_18 = in_RSI;
  iVar2 = strcmp(in_RSI,"LineLength");
  if (iVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,local_20,&local_41);
    std::__cxx11::stoul(in_stack_ffffffffffffefc0,
                        (size_t *)CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8),0);
    CheckLineLength(in_stack_fffffffffffff310,in_stack_fffffffffffff308,SUB21((ushort)uVar10 >> 8,0)
                    ,SUB21(uVar10,0));
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    local_1 = 1;
    goto LAB_00135b82;
  }
  bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                    (in_stack_ffffffffffffefd0);
  if (bVar1) {
    CheckLineLength(in_stack_fffffffffffff310,in_stack_fffffffffffff308,SUB21((ushort)uVar10 >> 8,0)
                    ,SUB21(uVar10,0));
  }
  iVar2 = strcmp(local_18,"DeclarationOrder");
  if (iVar2 == 0) {
    paVar7 = &local_79;
    pcVar3 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,pcVar3,paVar7);
    std::__cxx11::stoul(in_stack_ffffffffffffefc0,
                        (size_t *)CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8),0);
    pcVar3 = local_20 + 2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,pcVar3,&local_a1);
    std::__cxx11::stoul(in_stack_ffffffffffffefc0,
                        (size_t *)CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8),0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,local_20 + 4,&local_c9);
    std::__cxx11::stoul(in_stack_ffffffffffffefc0,
                        (size_t *)CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8),0);
    CheckDeclarationOrder
              (in_stack_fffffffffffff200,(size_t)in_stack_fffffffffffff1f8,
               (size_t)in_stack_fffffffffffff1f0,(size_t)in_stack_fffffffffffff1e8);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    local_1 = 1;
    goto LAB_00135b82;
  }
  iVar2 = strcmp(local_18,"Typedefs");
  if (iVar2 != 0) {
    iVar2 = strcmp(local_18,"InternalVariables");
    if (iVar2 != 0) {
      iVar2 = strcmp(local_18,"Variables");
      if (iVar2 == 0) {
        CheckVariables(in_stack_fffffffffffff948,in_stack_fffffffffffff940);
        local_1 = 1;
        goto LAB_00135b82;
      }
      iVar2 = strcmp(local_18,"Struct");
      if (iVar2 == 0) {
        CheckStruct(in_stack_fffffffffffff410,in_stack_fffffffffffff408,(bool)uVar11);
        local_1 = 1;
        goto LAB_00135b82;
      }
      iVar2 = strcmp(local_18,"MemberFunctions");
      if (iVar2 == 0) {
        paVar7 = &local_2e1;
        pcVar3 = local_20;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2e0,pcVar3,paVar7);
        std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
        paVar7 = &local_309;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_308,local_20,paVar7);
        std::allocator<char>::~allocator((allocator<char> *)&local_309);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_330,"0",&local_331);
        std::allocator<char>::~allocator((allocator<char> *)&local_331);
        local_340 = std::__cxx11::string::find((char *)local_2e0,0x1d805d);
        if (local_340 != -1) {
          std::__cxx11::string::substr((ulong)local_360,(ulong)local_2e0);
          std::__cxx11::string::operator=(local_308,local_360);
          std::__cxx11::string::~string(local_360);
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_380,(ulong)local_2e0);
          std::__cxx11::string::operator=(local_330,local_380);
          std::__cxx11::string::~string(local_380);
        }
        std::__cxx11::string::c_str();
        pcVar3 = (char *)std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3a0,pcVar3,&local_3a1);
        std::__cxx11::stoul(in_stack_ffffffffffffefc0,
                            (size_t *)CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8),
                            0);
        CheckMemberFunctions
                  (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
        std::__cxx11::string::~string(local_3a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
        local_1 = 1;
        std::__cxx11::string::~string(local_330);
        std::__cxx11::string::~string(local_308);
        std::__cxx11::string::~string(local_2e0);
        goto LAB_00135b82;
      }
      iVar2 = strcmp(local_18,"Functions");
      pcVar3 = local_20;
      if (iVar2 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3c8,pcVar3,&local_3c9);
        std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
        paVar7 = &local_3f1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3f0,local_20,paVar7);
        std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_418,"0",&local_419);
        std::allocator<char>::~allocator((allocator<char> *)&local_419);
        lVar4 = std::__cxx11::string::find((char *)local_3c8,0x1d805d);
        if (lVar4 != -1) {
          std::__cxx11::string::substr((ulong)&stack0xfffffffffffffbb8,(ulong)local_3c8);
          std::__cxx11::string::operator=(local_3f0,(string *)&stack0xfffffffffffffbb8);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffbb8);
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_468,(ulong)local_3c8);
          std::__cxx11::string::operator=(local_418,local_468);
          std::__cxx11::string::~string(local_468);
        }
        std::__cxx11::string::c_str();
        pcVar3 = (char *)std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_488,pcVar3,&local_489);
        std::__cxx11::stoul(in_stack_ffffffffffffefc0,
                            (size_t *)CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8),
                            0);
        CheckFunctions(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0
                      );
        std::__cxx11::string::~string(local_488);
        std::allocator<char>::~allocator((allocator<char> *)&local_489);
        local_1 = 1;
        std::__cxx11::string::~string(local_418);
        std::__cxx11::string::~string(local_3f0);
        std::__cxx11::string::~string(local_3c8);
        goto LAB_00135b82;
      }
      iVar2 = strcmp(local_18,"SemicolonSpace");
      if (iVar2 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_4b0,local_20,&local_4b1);
        std::__cxx11::stoul(in_stack_ffffffffffffefc0,
                            (size_t *)CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8),
                            0);
        CheckSemicolonSpace(in_stack_fffffffffffff1a0,in_stack_fffffffffffff198);
        std::__cxx11::string::~string(local_4b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
        local_1 = 1;
        goto LAB_00135b82;
      }
      iVar2 = strcmp(local_18,"EndOfFileNewLine");
      if (iVar2 == 0) {
        CheckEndOfFileNewLine(in_stack_fffffffffffff0c0);
        local_1 = 1;
        goto LAB_00135b82;
      }
      iVar2 = strcmp(local_18,"Tabs");
      if (iVar2 == 0) {
        CheckTabs((Parser *)CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090));
        local_1 = 1;
        goto LAB_00135b82;
      }
      iVar2 = strcmp(local_18,"Spaces");
      if (iVar2 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_4d8,local_20,&local_4d9);
        std::__cxx11::stoul(in_stack_ffffffffffffefc0,
                            (size_t *)CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8),
                            0);
        CheckExtraSpaces(in_stack_fffffffffffff0a0,in_stack_fffffffffffff098,
                         (bool)in_stack_fffffffffffff097);
        std::__cxx11::string::~string(local_4d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
        local_1 = 1;
        goto LAB_00135b82;
      }
      iVar2 = strcmp(local_18,"StatementPerLine");
      pcVar3 = local_20;
      uVar11 = (undefined1)(in_stack_fffffffffffff098 >> 0x38);
      if (iVar2 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_500,pcVar3,&local_501);
        std::allocator<char>::~allocator((allocator<char> *)&local_501);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_528,local_20,&local_529);
        std::allocator<char>::~allocator((allocator<char> *)&local_529);
        local_538 = std::__cxx11::string::find((char *)local_500,0x1d805d);
        local_539 = 1;
        if (local_538 != -1) {
          std::__cxx11::string::substr((ulong)local_560,(ulong)local_500);
          std::__cxx11::string::operator=(local_528,local_560);
          std::__cxx11::string::~string(local_560);
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_580,(ulong)local_500);
          bVar1 = std::operator==(in_stack_ffffffffffffefc0,
                                  (char *)CONCAT44(in_stack_ffffffffffffefbc,
                                                   in_stack_ffffffffffffefb8));
          if (bVar1) {
            local_539 = 0;
          }
          std::__cxx11::string::~string(local_580);
        }
        pcVar3 = (char *)std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5a0,pcVar3,&local_5a1);
        std::__cxx11::stoul(in_stack_ffffffffffffefc0,
                            (size_t *)CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8),
                            0);
        CheckStatementPerLine
                  (in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8,(bool)checkInlineFunctions_00
                  );
        std::__cxx11::string::~string(local_5a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
        local_1 = 1;
        std::__cxx11::string::~string(local_528);
        std::__cxx11::string::~string(local_500);
        goto LAB_00135b82;
      }
      iVar2 = strcmp(local_18,"BadCharacters");
      if (iVar2 == 0) {
        strcmp(local_20,"true");
        CheckBadCharacters(in_stack_fffffffffffff0a0,(bool)uVar11);
        local_1 = 1;
        goto LAB_00135b82;
      }
      iVar2 = strcmp(local_18,"VariablePerLine");
      if (iVar2 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5c8,local_20,&local_5c9);
        std::__cxx11::stoul(in_stack_ffffffffffffefc0,
                            (size_t *)CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8),
                            0);
        CheckVariablePerLine(in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8);
        std::__cxx11::string::~string(local_5c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
        local_1 = 1;
        goto LAB_00135b82;
      }
      iVar2 = strcmp(local_18,"Comments");
      if (iVar2 == 0) {
        paVar7 = &local_5f1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5f0,local_20,paVar7);
        std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
        local_600 = std::__cxx11::string::find((char *)local_5f0,0x1d805d);
        if (local_600 == -1) {
          poVar5 = std::operator<<((ostream *)&std::cout,"Comments not defined correctly");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          local_1 = 0;
          local_604 = 1;
        }
        else {
          std::__cxx11::string::substr((ulong)local_628,(ulong)local_5f0);
          local_630 = std::__cxx11::string::find((char *)local_5f0,0x1d805d);
          if (local_630 == -1) {
            poVar5 = std::operator<<((ostream *)&std::cout,"Comments not defined correctly");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            local_1 = 0;
            local_604 = 1;
          }
          else {
            std::__cxx11::string::substr((ulong)local_650,(ulong)local_5f0);
            local_600 = std::__cxx11::string::find((char *)local_5f0,0x1d805d);
            if (local_600 == -1) {
              poVar5 = std::operator<<((ostream *)&std::cout,"Comments not defined correctly");
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              local_1 = 0;
              local_604 = 1;
            }
            else {
              std::__cxx11::string::substr((ulong)local_670,(ulong)local_5f0);
              local_630 = std::__cxx11::string::find((char *)local_5f0,0x1d805d);
              paVar7 = &local_691;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_690,"",paVar7);
              std::allocator<char>::~allocator((allocator<char> *)&local_691);
              if (local_630 == -1) {
                psVar8 = local_5f0;
                std::__cxx11::string::length();
                std::__cxx11::string::substr((ulong)&stack0xfffffffffffff948,(ulong)psVar8);
                std::__cxx11::string::operator=(local_690,(string *)&stack0xfffffffffffff948);
                std::__cxx11::string::~string((string *)&stack0xfffffffffffff948);
              }
              else {
                std::__cxx11::string::substr((ulong)local_6d8,(ulong)local_5f0);
                std::__cxx11::string::operator=(local_690,local_6d8);
                std::__cxx11::string::~string(local_6d8);
              }
              pcVar3 = (char *)std::__cxx11::string::c_str();
              iVar2 = strcmp(pcVar3,"true");
              local_6d9 = iVar2 == 0;
              local_600 = std::__cxx11::string::find((char *)local_5f0,0x1d805d);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_700,"",&local_701);
              std::allocator<char>::~allocator((allocator<char> *)&local_701);
              if (local_600 == -1) {
                std::__cxx11::string::length();
                std::__cxx11::string::substr((ulong)local_728,(ulong)local_5f0);
                std::__cxx11::string::operator=(local_700,local_728);
                std::__cxx11::string::~string(local_728);
              }
              else {
                std::__cxx11::string::substr((ulong)local_748,(ulong)local_5f0);
                std::__cxx11::string::operator=(local_700,local_748);
                std::__cxx11::string::~string(local_748);
              }
              local_749 = 1;
              pcVar3 = (char *)std::__cxx11::string::c_str();
              iVar2 = strcmp(pcVar3,"false");
              if (iVar2 == 0) {
                local_749 = 0;
              }
              local_630 = std::__cxx11::string::find((char *)local_5f0,0x1d805d);
              paVar7 = &local_771;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_770,"",paVar7);
              std::allocator<char>::~allocator((allocator<char> *)&local_771);
              if (local_600 == -1) {
                std::__cxx11::string::length();
                std::__cxx11::string::substr((ulong)local_798,(ulong)local_5f0);
                std::__cxx11::string::operator=(local_770,local_798);
                std::__cxx11::string::~string(local_798);
              }
              else {
                std::__cxx11::string::substr((ulong)local_7b8,(ulong)local_5f0);
                std::__cxx11::string::operator=(local_770,local_7b8);
                std::__cxx11::string::~string(local_7b8);
              }
              pcVar3 = (char *)std::__cxx11::string::c_str();
              strcmp(pcVar3,"false");
              std::__cxx11::string::c_str();
              std::__cxx11::string::c_str();
              std::__cxx11::string::c_str();
              CheckComments(in_stack_fffffffffffff380,in_stack_fffffffffffff378,
                            in_stack_fffffffffffff370,in_stack_fffffffffffff368,
                            SUB81((ulong)in_stack_fffffffffffff360 >> 0x38,0),
                            SUB81((ulong)in_stack_fffffffffffff360 >> 0x30,0),
                            SUB81((ulong)in_stack_fffffffffffff360 >> 0x28,0));
              local_1 = 1;
              local_604 = 1;
              std::__cxx11::string::~string(local_770);
              std::__cxx11::string::~string(local_700);
              std::__cxx11::string::~string(local_690);
              std::__cxx11::string::~string(local_670);
            }
            std::__cxx11::string::~string(local_650);
          }
          std::__cxx11::string::~string(local_628);
        }
        std::__cxx11::string::~string(local_5f0);
        goto LAB_00135b82;
      }
      iVar2 = strcmp(local_18,"Header");
      if (iVar2 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_7e0,local_20,&local_7e1);
        std::allocator<char>::~allocator((allocator<char> *)&local_7e1);
        local_7f0 = std::__cxx11::string::find((char *)local_7e0,0x1d805d);
        if (local_7f0 == -1) {
          poVar5 = std::operator<<((ostream *)&std::cout,"Header not defined correctly");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          local_1 = 0;
          local_604 = 1;
        }
        else {
          paVar7 = &local_811;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_810,"",paVar7);
          std::allocator<char>::~allocator((allocator<char> *)&local_811);
          if (local_7f0 != 0) {
            std::__cxx11::string::substr((ulong)local_838,(ulong)local_7e0);
            std::__cxx11::string::operator=(local_810,local_838);
            std::__cxx11::string::~string(local_838);
          }
          lVar4 = std::__cxx11::string::find((char *)local_7e0,0x1d805d);
          if (lVar4 == -1) {
            poVar5 = std::operator<<((ostream *)&std::cout,"Header not defined correctly");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            local_1 = 0;
            local_604 = 1;
          }
          else {
            std::__cxx11::string::substr((ulong)local_860,(ulong)local_7e0);
            psVar8 = local_7e0;
            std::__cxx11::string::length();
            std::__cxx11::string::substr((ulong)local_880,(ulong)psVar8);
            local_881 = 0;
            local_882 = 0;
            pcVar3 = (char *)std::__cxx11::string::c_str();
            iVar2 = strcmp(pcVar3,"true");
            if (iVar2 == 0) {
              local_881 = 1;
            }
            pcVar3 = (char *)std::__cxx11::string::c_str();
            iVar2 = strcmp(pcVar3,"true");
            if (iVar2 == 0) {
              local_882 = 1;
            }
            uVar6 = std::__cxx11::string::empty();
            if ((uVar6 & 1) == 0) {
              std::__cxx11::string::c_str();
              CheckHeader(in_stack_fffffffffffff838,in_stack_fffffffffffff830,
                          (bool)in_stack_fffffffffffff82f,(bool)in_stack_fffffffffffff82e);
            }
            std::__cxx11::string::~string(local_880);
            std::__cxx11::string::~string(local_860);
            local_604 = 0;
          }
          std::__cxx11::string::~string(local_810);
        }
        std::__cxx11::string::~string(local_7e0);
joined_r0x001357fd:
        if (local_604 != 0) goto LAB_00135b82;
      }
      else {
        iVar2 = strcmp(local_18,"Indent");
        if (iVar2 == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_8a8,local_20,&local_8a9);
          std::allocator<char>::~allocator((allocator<char> *)&local_8a9);
          local_8b8 = std::__cxx11::string::find((char *)local_8a8,0x1d805d);
          if (local_8b8 == -1) {
            poVar5 = std::operator<<((ostream *)&std::cout,"Indent not defined correctly");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            local_1 = 0;
            local_604 = 1;
          }
          else {
            std::__cxx11::string::substr((ulong)local_8d8,(ulong)local_8a8);
            local_8e0 = std::__cxx11::string::find((char *)local_8a8,0x1d805d);
            if (local_8e0 == -1) {
              poVar5 = std::operator<<((ostream *)&std::cout,"Indent not defined correctly");
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              local_1 = 0;
              local_604 = 1;
            }
            else {
              std::__cxx11::string::substr((ulong)local_900,(ulong)local_8a8);
              local_8b8 = std::__cxx11::string::find((char *)local_8a8,0x1d805d);
              if (local_8b8 == -1) {
                poVar5 = std::operator<<((ostream *)&std::cout,"Indent not defined correctly");
                std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                local_1 = 0;
                local_604 = 1;
              }
              else {
                std::__cxx11::string::substr((ulong)local_920,(ulong)local_8a8);
                std::__cxx11::string::length();
                std::__cxx11::string::substr((ulong)local_940,(ulong)local_8a8);
                local_941 = 0;
                pcVar3 = (char *)std::__cxx11::string::c_str();
                iVar2 = strcmp(pcVar3,"true");
                if (iVar2 == 0) {
                  local_941 = 1;
                }
                local_942 = 0;
                pcVar3 = (char *)std::__cxx11::string::c_str();
                iVar2 = strcmp(pcVar3,"true");
                if (iVar2 == 0) {
                  local_942 = 1;
                }
                local_948 = 0;
                pcVar3 = (char *)std::__cxx11::string::c_str();
                iVar2 = strcmp(pcVar3,"TAB");
                if (iVar2 == 0) {
                  local_948 = 1;
                }
                pcVar3 = (char *)std::__cxx11::string::c_str();
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_968,pcVar3,&local_969);
                std::__cxx11::stoul(in_stack_ffffffffffffefc0,
                                    (size_t *)
                                    CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8),0)
                ;
                CheckIndent(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc4,
                            in_stack_fffffffffffffbb8,(bool)in_stack_fffffffffffffbb7,
                            (bool)in_stack_fffffffffffffbb6,in_stack_fffffffffffffbb0,
                            (bool)in_stack_fffffffffffffbaf);
                std::__cxx11::string::~string(local_968);
                std::allocator<char>::~allocator((allocator<char> *)&local_969);
                std::__cxx11::string::~string(local_940);
                std::__cxx11::string::~string(local_920);
                local_604 = 0;
              }
              std::__cxx11::string::~string(local_900);
            }
            std::__cxx11::string::~string(local_8d8);
          }
          std::__cxx11::string::~string(local_8a8);
          goto joined_r0x001357fd;
        }
        iVar2 = strcmp(local_18,"Namespace");
        if (iVar2 == 0) {
          CheckNamespace(in_stack_fffffffffffff168,(char *)in_stack_fffffffffffff160,
                         SUB81((ulong)in_stack_fffffffffffff158 >> 0x38,0));
        }
        else {
          iVar2 = strcmp(local_18,"NameOfClass");
          if (iVar2 == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_990,local_20,&local_991);
            std::allocator<char>::~allocator((allocator<char> *)&local_991);
            local_9a0 = std::__cxx11::string::find((char *)local_990,0x1d805d);
            bVar1 = local_9a0 != -1;
            if (bVar1) {
              std::__cxx11::string::substr((ulong)local_9c0,(ulong)local_990);
              std::__cxx11::string::length();
              std::__cxx11::string::substr((ulong)local_9e0,(ulong)local_990);
              std::__cxx11::string::c_str();
              std::__cxx11::string::c_str();
              CheckNameOfClass(in_stack_fffffffffffff1f8,in_stack_fffffffffffff1f0,
                               in_stack_fffffffffffff1e8);
              std::__cxx11::string::~string(local_9e0);
              std::__cxx11::string::~string(local_9c0);
            }
            else {
              poVar5 = std::operator<<((ostream *)&std::cout,"NameOfClass not defined correctly");
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              local_1 = 0;
            }
            local_604 = (uint)!bVar1;
            std::__cxx11::string::~string(local_990);
            goto joined_r0x001357fd;
          }
          iVar2 = strcmp(local_18,"IfNDefDefine");
          if (iVar2 == 0) {
            paVar7 = &local_a01;
            pcVar3 = local_20;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_a00,pcVar3,paVar7);
            std::allocator<char>::~allocator((allocator<char> *)&local_a01);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_a28,local_20,&local_a29);
            std::allocator<char>::~allocator((allocator<char> *)&local_a29);
            lVar4 = std::__cxx11::string::find((char *)local_a00,0x1d805d);
            if (lVar4 != -1) {
              std::__cxx11::string::substr((ulong)local_a58,(ulong)local_a00);
              psVar8 = local_a58;
              std::__cxx11::string::operator=(local_a28,psVar8);
              std::__cxx11::string::~string(psVar8);
              std::__cxx11::string::substr((ulong)local_a78,(ulong)local_a00);
              iVar2 = std::__cxx11::string::compare((char *)local_a78);
              if (iVar2 != 0) {
                std::__cxx11::string::compare((char *)local_a78);
              }
              std::__cxx11::string::~string(local_a78);
            }
            std::__cxx11::string::c_str();
            CheckIfNDefDefine(in_stack_fffffffffffff358,in_stack_fffffffffffff350,
                              (bool)uppercaseTheDefinition_00);
            std::__cxx11::string::~string(local_a28);
            std::__cxx11::string::~string(local_a00);
          }
          else {
            iVar2 = strcmp(local_18,"EmptyLines");
            if (iVar2 == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_a98,local_20,&local_a99);
              std::__cxx11::stoul(in_stack_ffffffffffffefc0,
                                  (size_t *)
                                  CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8),0);
              CheckEmptyLines(in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8,
                              (bool)checkEndOfFile);
              std::__cxx11::string::~string(local_a98);
              std::allocator<char>::~allocator((allocator<char> *)&local_a99);
            }
            else {
              iVar2 = strcmp(local_18,"Template");
              if (iVar2 != 0) {
                iVar2 = strcmp(local_18,"Operator");
                if (iVar2 == 0) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_ac0,local_20,&local_ac1);
                  std::allocator<char>::~allocator((allocator<char> *)&local_ac1);
                  local_ad0 = std::__cxx11::string::find((char *)local_ac0,0x1d805d);
                  bVar1 = local_ad0 != -1;
                  if (bVar1) {
                    std::__cxx11::string::substr((ulong)local_af0,(ulong)local_ac0);
                    std::__cxx11::string::length();
                    std::__cxx11::string::substr((ulong)local_b10,(ulong)local_ac0);
                    std::__cxx11::stoul(in_stack_ffffffffffffefc0,
                                        (size_t *)
                                        CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8
                                                ),0);
                    std::__cxx11::stoul(in_stack_ffffffffffffefc0,
                                        (size_t *)
                                        CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8
                                                ),0);
                    CheckOperator(in_stack_fffffffffffff160,
                                  (uint)((ulong)in_stack_fffffffffffff158 >> 0x20),
                                  (uint)in_stack_fffffffffffff158,in_stack_fffffffffffff150,
                                  (bool)doNotCheckInsideParenthesis);
                    std::__cxx11::string::~string(local_b10);
                    std::__cxx11::string::~string(local_af0);
                  }
                  else {
                    poVar5 = std::operator<<((ostream *)&std::cout,"Operator not defined correctly")
                    ;
                    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                    local_1 = 0;
                  }
                  local_604 = (uint)!bVar1;
                  std::__cxx11::string::~string(local_ac0);
                }
                else {
                  iVar2 = strcmp(local_18,"Comma");
                  if (iVar2 != 0) {
                    iVar2 = strcmp(local_18,"Parenthesis");
                    if (iVar2 == 0) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_ba0,local_20,&local_ba1);
                      std::__cxx11::stoul(in_stack_ffffffffffffefc0,
                                          (size_t *)
                                          CONCAT44(in_stack_ffffffffffffefbc,
                                                   in_stack_ffffffffffffefb8),0);
                      CheckParenthesis(in_stack_fffffffffffff220,uVar9);
                      std::__cxx11::string::~string(local_ba0);
                      std::allocator<char>::~allocator((allocator<char> *)&local_ba1);
                    }
                    else {
                      iVar2 = strcmp(local_18,"IfWhileForUntil");
                      if (iVar2 == 0) {
                        paVar7 = &local_bc9;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_bc8,local_20,paVar7);
                        uVar9 = (uint)((ulong)paVar7 >> 0x20);
                        std::__cxx11::stoul(in_stack_ffffffffffffefc0,
                                            (size_t *)
                                            CONCAT44(in_stack_ffffffffffffefbc,
                                                     in_stack_ffffffffffffefb8),0);
                        CheckIfWhileForUntil(in_stack_ffffffffffffefe0,uVar9);
                        std::__cxx11::string::~string(local_bc8);
                        std::allocator<char>::~allocator((allocator<char> *)&local_bc9);
                      }
                      else {
                        iVar2 = strcmp(local_18,"BlackList");
                        if (iVar2 == 0) {
                          CheckBlackList(in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0);
                        }
                        else {
                          iVar2 = strcmp(local_18,"UsingDirectives");
                          if (iVar2 == 0) {
                            iVar2 = strcmp(local_20,"0");
                            if (iVar2 != 0) {
                              strcmp(local_20,"false");
                            }
                            CheckUsingDirectives
                                      ((Parser *)
                                       CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8)
                                       ,(bool)forbidUsingDirectives_00);
                          }
                          else {
                            iVar2 = strcmp(local_18,"RelativePathInInclude");
                            if (iVar2 == 0) {
                              iVar2 = strcmp(local_20,"0");
                              if (iVar2 != 0) {
                                strcmp(local_20,"false");
                              }
                              CheckRelativePathInInclude
                                        (in_stack_fffffffffffff068,(bool)forbidRelativePaths_00);
                            }
                          }
                        }
                      }
                    }
                    goto LAB_00135b7a;
                  }
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_b30,local_20,&local_b31);
                  std::allocator<char>::~allocator((allocator<char> *)&local_b31);
                  lVar4 = std::__cxx11::string::find((char *)local_b30,0x1d805d);
                  if (lVar4 != -1) {
                    std::__cxx11::string::substr((ulong)local_b60,(ulong)local_b30);
                    std::__cxx11::string::length();
                    std::__cxx11::string::substr((ulong)&stack0xfffffffffffff480,(ulong)local_b30);
                    std::__cxx11::stoul(in_stack_ffffffffffffefc0,
                                        (size_t *)
                                        CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8
                                                ),0);
                    std::__cxx11::stoul(in_stack_ffffffffffffefc0,
                                        (size_t *)
                                        CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8
                                                ),0);
                    CheckComma(in_stack_fffffffffffff0e0,
                               (uint)((ulong)in_stack_fffffffffffff0d8 >> 0x20),
                               (uint)in_stack_fffffffffffff0d8);
                    std::__cxx11::string::~string((string *)&stack0xfffffffffffff480);
                    std::__cxx11::string::~string(local_b60);
                  }
                  else {
                    poVar5 = std::operator<<((ostream *)&std::cout,"Comma not defined correctly");
                    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                    local_1 = 0;
                  }
                  local_604 = (uint)(lVar4 == -1);
                  std::__cxx11::string::~string(local_b30);
                }
                goto joined_r0x001357fd;
              }
              CheckTemplate(in_stack_fffffffffffff380,in_stack_fffffffffffff378);
            }
          }
        }
      }
LAB_00135b7a:
      local_1 = 0;
      goto LAB_00135b82;
    }
    local_191 = 1;
    local_192 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b8,local_20,&local_1b9);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
    local_1c8 = std::__cxx11::string::find((char *)local_1b8,0x1d805d);
    if (local_1c8 != -1) {
      std::__cxx11::string::substr((ulong)local_1e8,(ulong)local_1b8);
      local_1f0 = std::__cxx11::string::find((char *)local_1b8,0x1d805d);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_210,"",&local_211);
      std::allocator<char>::~allocator((allocator<char> *)&local_211);
      if (local_1f0 == -1) {
        psVar8 = local_1b8;
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)local_238,(ulong)psVar8);
        std::__cxx11::string::operator=(local_210,local_238);
        std::__cxx11::string::~string(local_238);
      }
      else {
        std::__cxx11::string::substr((ulong)&stack0xfffffffffffffda8,(ulong)local_1b8);
        std::__cxx11::string::operator=(local_210,(string *)&stack0xfffffffffffffda8);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffda8);
      }
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iVar2 = strcmp(pcVar3,"false");
      if (iVar2 == 0) {
LAB_001326e5:
        local_191 = 0;
      }
      else {
        pcVar3 = (char *)std::__cxx11::string::c_str();
        iVar2 = strcmp(pcVar3,"0");
        if (iVar2 == 0) goto LAB_001326e5;
      }
      if (local_1f0 != -1) {
        local_1c8 = std::__cxx11::string::find((char *)local_1b8,0x1d805d);
        paVar7 = &local_279;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_278,"",paVar7);
        std::allocator<char>::~allocator((allocator<char> *)&local_279);
        if (local_1c8 == -1) {
          psVar8 = local_1b8;
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_2a0,(ulong)psVar8);
          std::__cxx11::string::operator=(local_278,local_2a0);
          std::__cxx11::string::~string(local_2a0);
        }
        else {
          std::__cxx11::string::substr((ulong)local_2c0,(ulong)local_1b8);
          std::__cxx11::string::operator=(local_278,local_2c0);
          std::__cxx11::string::~string(local_2c0);
        }
        pcVar3 = (char *)std::__cxx11::string::c_str();
        iVar2 = strcmp(pcVar3,"true");
        if (iVar2 == 0) {
LAB_001328d1:
          local_192 = 1;
        }
        else {
          pcVar3 = (char *)std::__cxx11::string::c_str();
          iVar2 = strcmp(pcVar3,"1");
          if (iVar2 == 0) goto LAB_001328d1;
        }
        std::__cxx11::string::~string(local_278);
      }
      std::__cxx11::string::operator=(local_1b8,local_1e8);
      std::__cxx11::string::~string(local_210);
      std::__cxx11::string::~string(local_1e8);
    }
    std::__cxx11::string::c_str();
    CheckInternalVariables
              (in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,(bool)in_stack_fffffffffffff7b7,
               (bool)in_stack_fffffffffffff7b6);
    local_1 = 1;
    std::__cxx11::string::~string(local_1b8);
    goto LAB_00135b82;
  }
  local_ca = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,local_20,&local_f1);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  local_100 = std::__cxx11::string::find((char *)local_f0,0x1d805d);
  if (local_100 != -1) {
    std::__cxx11::string::substr((ulong)local_120,(ulong)local_f0);
    local_128 = std::__cxx11::string::find((char *)local_f0,0x1d805d);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,"",&local_149);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    if (local_128 == -1) {
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_170,(ulong)local_f0);
      std::__cxx11::string::operator=(local_148,local_170);
      std::__cxx11::string::~string(local_170);
    }
    else {
      std::__cxx11::string::substr((ulong)local_190,(ulong)local_f0);
      std::__cxx11::string::operator=(local_148,local_190);
      std::__cxx11::string::~string(local_190);
    }
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar2 = strcmp(pcVar3,"false");
    if (iVar2 == 0) {
LAB_00132369:
      local_ca = 0;
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iVar2 = strcmp(pcVar3,"0");
      if (iVar2 == 0) goto LAB_00132369;
    }
    std::__cxx11::string::operator=(local_f0,local_120);
    std::__cxx11::string::~string(local_148);
    std::__cxx11::string::~string(local_120);
  }
  std::__cxx11::string::c_str();
  CheckTypedefs(in_stack_fffffffffffff490,in_stack_fffffffffffff488,(bool)in_stack_fffffffffffff487,
                in_stack_fffffffffffff480);
  local_1 = 1;
  std::__cxx11::string::~string(local_f0);
LAB_00135b82:
  return (bool)(local_1 & 1);
}

Assistant:

bool Parser::Check(const char* name, const char* value)
{
  if(!strcmp(name,"LineLength"))
    {
    this->CheckLineLength(std::stoul(value));
    return true;
    }
  else if(m_Positions.empty())
    {
    this->CheckLineLength(0,false,false); // run CheckLineLength without errors to fill m_Positions
    }
  if(!strcmp(name,"DeclarationOrder"))
    {
    this->CheckDeclarationOrder(std::stoul(&value[0]),std::stoul(&value[2]),std::stoul(&value[4]));
    return true;
    }
  if(!strcmp(name,"Typedefs"))
    {
    bool alignment = true; // check alignment by default
    std::string val = value;
    size_t pos = val.find(",",0);
    if(pos != std::string::npos)
      {
      std::string v1 = val.substr(0,pos);

      // Check the alignment
      size_t pos1 = val.find(",",pos+1);

      std::string v2 = "";
      if(pos1 == std::string::npos)
        {
        v2 = val.substr(pos+1,val.size()-pos-1);
        }
      else
        {
        v2 = val.substr(pos+1,pos1-pos-1);
        }

      if(!strcmp(v2.c_str(),"false") || !strcmp(v2.c_str(),"0"))
        {
        alignment = false;
        }
      val = v1;
      }

    this->CheckTypedefs(val.c_str(),alignment);
    return true;
    }
  if(!strcmp(name,"InternalVariables"))
    {
    bool alignment = true; // check alignment by default
    bool checkProtected = false; // check protected by default
    std::string val = value;
    size_t pos = val.find(",",0);
    if(pos != std::string::npos)
      {
      std::string v1 = val.substr(0,pos);

      // Check the alignment
      size_t pos1 = val.find(",",pos+1);

      std::string v2 = "";
      if(pos1 == std::string::npos)
        {
        v2 = val.substr(pos+1,val.size()-pos-1);
        }
      else
        {
        v2 = val.substr(pos+1,pos1-pos-1);
        }

      if(!strcmp(v2.c_str(),"false") || !strcmp(v2.c_str(),"0"))
        {
        alignment = false;
        }

      if(pos1 != std::string::npos)
        {
        // Check the protected
        pos = val.find(",",pos1+1);
        std::string v3 = "";
        if(pos == std::string::npos)
          {
          v3 = val.substr(pos1+1,val.size()-pos1-1);
          }
        else
          {
          v3 = val.substr(pos1+1,pos-pos1-1);
          }

        if(!strcmp(v3.c_str(),"true") || !strcmp(v3.c_str(),"1"))
          {
          checkProtected = true;
          }
        }
      val = v1;
      }

    this->CheckInternalVariables(val.c_str(),alignment,checkProtected);

    return true;
    }
  if(!strcmp(name,"Variables"))
    {
    this->CheckVariables(value);
    return true;
    }
  if(!strcmp(name,"Struct"))
    {
    this->CheckStruct(value);
    return true;
    }
  if(!strcmp(name,"MemberFunctions"))
    {
    std::string val = value;
    std::string v1 = value;
    std::string v2 = "0";
    size_t pos = val.find(",",0);
    if(pos != std::string::npos)
      {
      v1 = val.substr(0,pos);
      v2 = val.substr(pos+1,val.size()-pos-1);
      }
    this->CheckMemberFunctions(v1.c_str(),std::stoul(v2.c_str()));
    return true;
    }
  if(!strcmp(name,"Functions"))
    {
    std::string val = value;
    std::string v1 = value;
    std::string v2 = "0";
    size_t pos = val.find(",",0);
    if(pos != std::string::npos)
      {
      v1 = val.substr(0,pos);
      v2 = val.substr(pos+1,val.size()-pos-1);
      }
    this->CheckFunctions(v1.c_str(),std::stoul(v2.c_str()));
    return true;
    }
  if(!strcmp(name,"SemicolonSpace"))
    {
    this->CheckSemicolonSpace(std::stoul(value));
    return true;
    }
  if(!strcmp(name,"EndOfFileNewLine"))
    {
    this->CheckEndOfFileNewLine();
    return true;
    }
  if(!strcmp(name,"Tabs"))
    {
    this->CheckTabs();
    return true;
    }
  if(!strcmp(name,"Spaces"))
    {
    this->CheckExtraSpaces(std::stoul(value));
    return true;
    }
  if(!strcmp(name,"StatementPerLine"))
    {
    std::string val = value;
    std::string v1 = value;
    size_t pos = val.find(",",0);
    bool checkInlineFunctions = true;
    if(pos != std::string::npos)
      {
      v1 = val.substr(0,pos);
      std::string v2 = val.substr(pos+1,val.size()-pos-1);
      if(v2 == "0")
        {
        checkInlineFunctions = false;
        }
      }

    this->CheckStatementPerLine(std::stoul(v1.c_str()),checkInlineFunctions);
    return true;
    }
 if(!strcmp(name,"BadCharacters"))
    {
    this->CheckBadCharacters(!strcmp(value,"true"));
    return true;
    }
  if(!strcmp(name,"VariablePerLine"))
    {
    this->CheckVariablePerLine(std::stoul(value));
    return true;
    }
  if(!strcmp(name,"Comments"))
    {
    std::string val = value;
    size_t pos = val.find(",",0);
    if(pos == std::string::npos)
      {
      std::cout << "Comments not defined correctly" << std::endl;
      return false;
      }
    std::string v1 = val.substr(0,pos);
    auto pos1 = val.find(",", pos + 1);
    if(pos1 == std::string::npos)
      {
      std::cout << "Comments not defined correctly" << std::endl;
      return false;
      }
    std::string v2 = val.substr(pos+1,pos1-pos-1);
    pos = val.find(",",pos1+1);
    if(pos == std::string::npos)
      {
      std::cout << "Comments not defined correctly" << std::endl;
      return false;
      }
    std::string v3 = val.substr(pos1+1,pos-pos1-1);

    // Check if we allow empty lines before /class
    pos1 = val.find(",",pos+1);
    std::string v4 = "";
    if(pos1 == std::string::npos)
      {
      v4 = val.substr(pos+1,val.length()-pos-1);
      }
    else
      {
      v4 = val.substr(pos+1,pos1-pos-1);
      }

    bool allowEmptyLine = !strcmp(v4.c_str(),"true");

    // Check if we should check the comments misspeling
    pos = val.find(",",pos1+1);
    std::string v5 = "";
    if(pos == std::string::npos)
      {
      v5 = val.substr(pos1+1,val.length()-pos1-1);
      }
    else
      {
      v5 = val.substr(pos1+1,pos-pos1-1);
      }

    bool checkWrongComment = true;
    if(!strcmp(v5.c_str(),"false"))
      {
      checkWrongComment = false;
      }

    // Check if we should check the missing comments
    pos1 = val.find(",",pos+1);
    std::string v6 = "";
    if(pos == std::string::npos)
      {
      v6 = val.substr(pos+1,val.length()-pos-1);
      }
    else
      {
      v6 = val.substr(pos+1,pos1-pos-1);
      }

    bool checkMissingComment = true;
    if(!strcmp(v6.c_str(),"false"))
      {
      checkMissingComment = false;
      }

    this->CheckComments(v1.c_str(),v2.c_str(),v3.c_str(),allowEmptyLine,checkWrongComment,checkMissingComment);

    return true;
    }
  // should be before CheckIndent
  else if(!strcmp(name,"Header"))
    {
    std::string val = value;
    size_t pos = val.find(",",0);
    if(pos == std::string::npos)
      {
      std::cout << "Header not defined correctly" << std::endl;
      return false;
      }

    std::string v1 = "";
    if(pos>0)
      {
      v1 = val.substr(0,pos);
      }

      auto pos1 = val.find(",", pos + 1);
      if (pos1 == std::string::npos) {
        std::cout << "Header not defined correctly" << std::endl;
        return false;
      }

    std::string v2 = val.substr(pos+1,pos1-pos-1);
    std::string v3 = val.substr(pos1+1,val.length()-pos1-1);

    bool spaceEndOfLine = false;
    bool useCVS = false;

    if(!strcmp(v2.c_str(),"true"))
      {
      spaceEndOfLine = true;
      }
    if(!strcmp(v3.c_str(),"true"))
      {
      useCVS = true;
      }

      if (!v1.empty()) {
        this->CheckHeader(v1.c_str(), spaceEndOfLine, useCVS);
      }
    }

   else if(!strcmp(name,"Indent"))
    {
    std::string val = value;
    size_t pos = val.find(",",0);
    if(pos == std::string::npos)
      {
      std::cout << "Indent not defined correctly" << std::endl;
      return false;
      }
    std::string v1 = val.substr(0,pos);
    auto pos1 = val.find(",", pos + 1);
    if(pos1 == std::string::npos)
      {
      std::cout << "Indent not defined correctly" << std::endl;
      return false;
      }
    std::string v2 = val.substr(pos+1,pos1-pos-1);
    pos = val.find(",",pos1+1);
    if(pos == std::string::npos)
      {
      std::cout << "Indent not defined correctly" << std::endl;
      return false;
      }
    std::string v3 = val.substr(pos1+1,pos-pos1-1);
    std::string v4 = val.substr(pos+1,val.length()-pos-1);
    bool header = false;
    if(!strcmp(v3.c_str(),"true"))
      {
      header = true;
      }
    bool blockline = false;
    if(!strcmp(v4.c_str(),"true"))
      {
      blockline = true;
      }

    IndentType itype = kws::SPACE;

    if(!strcmp(v1.c_str(),"TAB"))
      {
      itype = kws::TAB;
      }
    this->CheckIndent(itype,std::stoul(v2.c_str()),header,blockline);
    }

  else if(!strcmp(name,"Namespace"))
    {
    this->CheckNamespace(value);
    }
  else if(!strcmp(name,"NameOfClass"))
    {
    std::string val = value;
    size_t pos = val.find(",",0);
    if(pos == std::string::npos)
      {
      std::cout << "NameOfClass not defined correctly" << std::endl;
      return false;
      }
    std::string v1 = val.substr(0,pos);
    std::string v2 = val.substr(pos+1,val.length()-pos-1);
    this->CheckNameOfClass(v1.c_str(),v2.c_str());
    }
  else if(!strcmp(name,"IfNDefDefine"))
    {
    std::string val = value;
    std::string v1 = value;
    bool uppercaseTheDefinition = false;
    const size_t pos = val.find(",", 0);
    if(pos != std::string::npos)
      {
      v1 = val.substr(0, pos);
      std::string v2 = val.substr(pos+1);
      uppercaseTheDefinition = !v2.compare("true") || !v2.compare("1");
      }
    this->CheckIfNDefDefine(v1.c_str(), uppercaseTheDefinition);
    }
  else if(!strcmp(name,"EmptyLines"))
    {
    this->CheckEmptyLines(std::stoul(value));
    }
  else if(!strcmp(name,"Template"))
    {
    this->CheckTemplate(value);
    }
  else if(!strcmp(name,"Operator"))
    {
    std::string val = value;
    const size_t pos = val.find(",",0);
    if(pos == std::string::npos)
      {
      std::cout << "Operator not defined correctly" << std::endl;
      return false;
      }
    std::string v1 = val.substr(0,pos);
    std::string v2 = val.substr(pos+1,val.length()-pos-1);
    this->CheckOperator(std::stoul(v1),std::stoul(v2));
    }
  else if(!strcmp(name,"Comma"))
    {
    std::string val = value;
    const size_t pos = val.find(",",0);
    if(pos == std::string::npos)
      {
      std::cout << "Comma not defined correctly" << std::endl;
      return false;
      }
    std::string v1 = val.substr(0,pos);
    std::string v2 = val.substr(pos+1,val.length()-pos-1);
    this->CheckComma(std::stoul(v1),std::stoul(v2));
    }
  else if(!strcmp(name,"Parenthesis"))
    {
    this->CheckParenthesis(std::stoul(value));
    }
  else if(!strcmp(name,"IfWhileForUntil"))
    {
    this->CheckIfWhileForUntil(std::stoul(value));
    }
  else if(!strcmp(name,"BlackList"))
    {
    this->CheckBlackList(value);
    }
  else if(!strcmp(name, "UsingDirectives"))
    {
    bool forbidUsingDirectives = true;
    if( !strcmp(value, "0") || !strcmp(value, "false"))
      forbidUsingDirectives = false;
    this->CheckUsingDirectives(forbidUsingDirectives);
    }
  else if(!strcmp(name, "RelativePathInInclude"))
    {
    bool forbidRelativePaths = true;
    if( !strcmp(value, "0") || !strcmp(value, "false"))
      forbidRelativePaths = false;
    this->CheckRelativePathInInclude(forbidRelativePaths);
    }
  return false;
}